

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cc
# Opt level: O2

void __thiscall DBSQLite::update(DBSQLite *this,Tle *tle)

{
  string q;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined8 local_190 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)local_190,"INSERT OR REPLACE INTO tle (name, norad, line1, line2) ",
             (allocator *)&local_1b0);
  std::__cxx11::string::string((string *)&local_110,(string *)tle);
  std::operator+(&local_f0,"VALUES (\'",&local_110);
  std::operator+(&local_d0,&local_f0,"\', ");
  std::__cxx11::to_string(&local_130,tle->norad_number_);
  std::operator+(&local_b0,&local_d0,&local_130);
  std::operator+(&local_90,&local_b0,", \"");
  std::__cxx11::string::string((string *)&local_150,(string *)&tle->line_one_);
  std::operator+(&local_70,&local_90,&local_150);
  std::operator+(&local_50,&local_70,"\", \"");
  std::__cxx11::string::string((string *)&local_170,(string *)&tle->line_two_);
  std::operator+(&local_30,&local_50,&local_170);
  std::operator+(&local_1b0,&local_30,"\");");
  std::__cxx11::string::append((string *)local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  sqlite3_exec(this->_sql,local_190[0],0,0,0);
  std::__cxx11::string::~string((string *)local_190);
  return;
}

Assistant:

void DBSQLite::update(const Tle &tle) {
  std::string q = "INSERT OR REPLACE INTO tle (name, norad, line1, line2) ";
  q += "VALUES (\'" + tle.Name() + "\', " + std::to_string(tle.NoradNumber()) +
       ", \"" + tle.Line1() + "\", \"" + tle.Line2() + "\");";
  sqlite3_exec(_sql, q.c_str(), nullptr, nullptr, nullptr);
}